

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall
Highs::getReducedColumn
          (Highs *this,HighsInt col,double *col_vector,HighsInt *col_num_nz,HighsInt *col_indices)

{
  reference pvVar1;
  reference pvVar2;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  HighsInt el;
  vector<double,_std::allocator<double>_> rhs;
  HighsInt num_row;
  HighsInt *in_stack_00000060;
  double *in_stack_00000068;
  vector<double,_std::allocator<double>_> *in_stack_00000070;
  Highs *in_stack_00000078;
  HighsLp *lp;
  size_type in_stack_ffffffffffffff38;
  value_type vVar3;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  int iVar4;
  string *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  int local_94;
  vector<double,_std::allocator<double>_> local_88;
  int local_70;
  allocator local_59;
  string local_58 [32];
  int *local_38;
  long local_20;
  uint local_14;
  HighsStatus local_4;
  
  local_38 = (int *)(in_RDI + 0x138);
  local_20 = in_RDX;
  local_14 = in_ESI;
  HighsLp::ensureColwise((HighsLp *)0x490516);
  if (local_20 == 0) {
    highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kError,"getReducedColumn: col_vector is NULL\n"
                );
    local_4 = kError;
  }
  else if (((int)local_14 < 0) || (*local_38 <= (int)local_14)) {
    highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kError,
                 "Column index %d out of range [0, %d] in getReducedColumn\n",(ulong)local_14,
                 (ulong)(*local_38 - 1));
    local_4 = kError;
  }
  else if ((*(byte *)(in_RDI + 0x3850) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"getReducedColumn",&local_59);
    local_4 = invertRequirementError
                        ((Highs *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                         in_stack_ffffffffffffff48);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
  }
  else {
    local_70 = local_38[1];
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x490687);
    std::vector<double,_std::allocator<double>_>::assign
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               in_stack_ffffffffffffff38,(value_type_conflict1 *)0x4906a4);
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(local_38 + 0x24),(long)(int)local_14);
    local_94 = *pvVar1;
    while( true ) {
      iVar4 = local_94;
      pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_38 + 0x24),
                          (long)(int)(local_14 + 1));
      if (*pvVar1 <= iVar4) break;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_38 + 0x36),
                          (long)local_94);
      vVar3 = *pvVar2;
      pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_38 + 0x30),(long)local_94);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_88,(long)*pvVar1);
      *pvVar2 = vVar3;
      local_94 = local_94 + 1;
    }
    basisSolveInterface(in_stack_00000078,in_stack_00000070,in_stack_00000068,in_stack_00000060,
                        _num_row,rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage._7_1_);
    local_4 = kOk;
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  }
  return local_4;
}

Assistant:

HighsStatus Highs::getReducedColumn(const HighsInt col, double* col_vector,
                                    HighsInt* col_num_nz,
                                    HighsInt* col_indices) {
  HighsLp& lp = model_.lp_;
  // Ensure that the LP is column-wise
  lp.ensureColwise();
  if (col_vector == NULL) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "getReducedColumn: col_vector is NULL\n");
    return HighsStatus::kError;
  }
  // col_indices can be NULL - it's the trigger that determines
  // whether they are identified or not
  if (col < 0 || col >= lp.num_col_) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Column index %" HIGHSINT_FORMAT
                 " out of range [0, %" HIGHSINT_FORMAT
                 "] in getReducedColumn\n",
                 col, lp.num_col_ - 1);
    return HighsStatus::kError;
  }
  if (!ekk_instance_.status_.has_invert)
    return invertRequirementError("getReducedColumn");
  HighsInt num_row = lp.num_row_;
  vector<double> rhs;
  rhs.assign(num_row, 0);
  for (HighsInt el = lp.a_matrix_.start_[col];
       el < lp.a_matrix_.start_[col + 1]; el++)
    rhs[lp.a_matrix_.index_[el]] = lp.a_matrix_.value_[el];
  basisSolveInterface(rhs, col_vector, col_num_nz, col_indices, false);
  return HighsStatus::kOk;
}